

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::NewJavascriptArrayNoArg(ScriptContext *requestContext)

{
  bool bVar1;
  ThreadContext *threadContext;
  JavascriptLibrary *this;
  JavascriptArray *local_38;
  JavascriptArray *newArray;
  JsReentLock reentrancylock;
  ScriptContext *requestContext_local;
  
  reentrancylock._24_8_ = requestContext;
  threadContext = ScriptContext::GetThreadContext(requestContext);
  JsReentLock::JsReentLock((JsReentLock *)&newArray,threadContext);
  this = ScriptContext::GetLibrary((ScriptContext *)reentrancylock._24_8_);
  local_38 = JavascriptLibrary::CreateArray(this);
  bVar1 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
  if (bVar1) {
    local_38 = (JavascriptArray *)Js::JavascriptProxy::AutoProxyWrapper(local_38);
  }
  JsReentLock::~JsReentLock((JsReentLock *)&newArray);
  return local_38;
}

Assistant:

Var JavascriptOperators::NewJavascriptArrayNoArg(ScriptContext* requestContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(NewJavascriptArrayNoArg, reentrancylock, requestContext->GetThreadContext());
        JavascriptArray * newArray = requestContext->GetLibrary()->CreateArray();
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newArray));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            newArray = static_cast<JavascriptArray*>(JavascriptProxy::AutoProxyWrapper(newArray));
        }
#endif
        return newArray;
        JIT_HELPER_END(NewJavascriptArrayNoArg);
    }